

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall CBlockPolicyEstimator::FlushUnconfirmed(CBlockPolicyEstimator *this)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  size_t sVar2;
  ConstevalFormatString<2U> fmt;
  CBlockPolicyEstimator *in_RDI;
  long in_FS_OFFSET;
  time_point endclear;
  iterator mi;
  size_t num_entries;
  time_point startclear;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  Level in_stack_000000d0;
  unsigned_long *in_stack_000000e0;
  double *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  *in_stack_ffffffffffffff30;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  LogFlags in_stack_ffffffffffffff90;
  CBlockPolicyEstimator *pCVar3;
  int source_line;
  char *in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar4;
  
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  pCVar3 = in_RDI;
  sVar2 = std::chrono::_V2::steady_clock::now();
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60
             ,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             SUB41((uint)in_stack_ffffffffffffff48 >> 0x18,0));
  fmt.fmt = (char *)std::
                    map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                    ::size((map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while( true ) {
    bVar1 = std::
            map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
            ::empty((map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    source_line = (int)((ulong)pCVar3 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
    ::begin(in_stack_ffffffffffffff30);
    std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>::
    operator->((_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    _removeTx(in_RDI,(uint256 *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
              SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
  }
  std::chrono::_V2::steady_clock::now();
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff30,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff28 = 1;
    logging_function._M_str = pcVar4;
    logging_function._M_len = in_stack_fffffffffffffff0;
    source_file._M_str = in_stack_ffffffffffffffe8;
    source_file._M_len = sVar2;
    LogPrintFormatInternal<unsigned_long,double>
              (logging_function,source_file,source_line,in_stack_ffffffffffffff90,in_stack_000000d0,
               fmt,in_stack_000000e0,in_stack_000000e8);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBlockPolicyEstimator::FlushUnconfirmed()
{
    const auto startclear{SteadyClock::now()};
    LOCK(m_cs_fee_estimator);
    size_t num_entries = mapMemPoolTxs.size();
    // Remove every entry in mapMemPoolTxs
    while (!mapMemPoolTxs.empty()) {
        auto mi = mapMemPoolTxs.begin();
        _removeTx(mi->first, false); // this calls erase() on mapMemPoolTxs
    }
    const auto endclear{SteadyClock::now()};
    LogDebug(BCLog::ESTIMATEFEE, "Recorded %u unconfirmed txs from mempool in %.3fs\n", num_entries, Ticks<SecondsDouble>(endclear - startclear));
}